

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  Index IVar2;
  Index IVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  undefined4 local_324;
  undefined *local_320;
  undefined4 *local_318;
  undefined **local_310;
  undefined **local_308;
  ulong local_300;
  shared_count sStack_2f8;
  undefined4 **local_2f0;
  char *local_2e8;
  char *local_2e0;
  shared_count sStack_2d8;
  undefined **local_2d0;
  undefined1 local_2c8;
  undefined8 *local_2c0;
  undefined ***local_2b8;
  undefined4 **local_2b0;
  char *local_2a8;
  undefined **local_2a0;
  char *local_298;
  shared_count sStack_290;
  char *local_288;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
  *local_280;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 local_210 [24];
  undefined4 ***local_1f8;
  pointer local_1f0;
  pointer ppEStack_1e8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1d8;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined1 local_190 [16];
  pointer pvStack_180;
  Index local_178;
  pointer local_170;
  pointer ppEStack_168;
  pointer local_160;
  undefined1 local_158 [56];
  undefined8 local_120;
  undefined8 uStack_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_210,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_190,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_210);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_190);
  build_column_values<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_210,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_190,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_210);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_190);
  local_278 = matrix;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  Vector_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>>>>
            ((Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)local_190,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_280 = rows;
  IVar2 = local_190._0_4_;
  IVar3 = local_178;
  local_1f0 = local_170;
  ppEStack_1e8 = ppEStack_168;
  while ((_Rb_tree_header *)p_Var7 != p_Var1) {
    local_190._0_4_ = IVar2;
    local_178 = IVar3;
    local_170 = local_1f0;
    ppEStack_168 = ppEStack_1e8;
    if (p_Var7[2]._M_left != (_Base_ptr)0x0) {
      lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var7[1]._M_left);
      if ((*(uint *)(lVar6 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar6 + 0x24) & 0x1f) & 1) != 0)) {
        local_220 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_218 = "";
        local_230 = &boost::unit_test::basic_cstring<char_const>::null;
        local_228 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x20d);
        local_300 = local_300 & 0xffffffffffffff00;
        local_308 = &PTR__lazy_ostream_001db440;
        sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2f0 = (undefined4 **)0x1a71a4;
        local_318 = (undefined4 *)CONCAT44(local_318._4_4_,*(int *)(lVar6 + 0x20));
        local_320 = (undefined *)CONCAT44(local_320._4_4_,6);
        local_2a0 = (undefined **)CONCAT71(local_2a0._1_7_,*(int *)(lVar6 + 0x20) == 6);
        local_298 = (char *)0x0;
        sStack_290.pi_ = (sp_counted_base *)0x0;
        local_2e8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2e0 = "";
        local_2b0 = &local_318;
        local_210._8_8_ = local_210._8_8_ & 0xffffffffffffff00;
        local_210._0_8_ = &PTR__lazy_ostream_001db900;
        local_210._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_1f8 = &local_2b0;
        local_310 = &local_320;
        local_2c8 = 0;
        local_2d0 = &PTR__lazy_ostream_001db940;
        local_2c0 = &boost::unit_test::lazy_ostream::inst;
        local_2b8 = &local_310;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a0,&local_308,&local_2e8,0x20d,1,2,2,"entry.get_column_index()",local_210
                   ,"6",&local_2d0);
        boost::detail::shared_count::~shared_count(&sStack_290);
      }
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    IVar2 = local_190._0_4_;
    IVar3 = local_178;
    local_1f0 = local_170;
    ppEStack_1e8 = ppEStack_168;
  }
  local_190._0_4_ = 0;
  local_210._4_4_ = (undefined4)((ulong)local_210._0_8_ >> 0x20);
  local_210._0_4_ = IVar2;
  pvStack_180 = (pointer)0xffffffffffffffff;
  local_178 = 0xffffffff;
  uVar4 = (ulong)local_1f8 >> 0x20;
  local_1f8 = (undefined4 ***)CONCAT44((int)uVar4,IVar3);
  local_170 = (pointer)0x0;
  ppEStack_168 = (pointer)0x0;
  local_160 = (pointer)0x0;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&local_1d8,local_158,local_158);
  local_1a0 = (undefined4)local_120;
  uStack_19c = local_120._4_4_;
  uStack_198 = (undefined4)uStack_118;
  uStack_194 = uStack_118._4_4_;
  local_120 = (Field_operators *)0x0;
  uStack_118 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
  local_2a0 = &PTR__lazy_ostream_001db440;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_320 = (undefined *)((long)ppEStack_1e8 - (long)local_1f0 >> 3);
  local_310 = &local_320;
  local_318 = &local_324;
  local_324 = 4;
  local_2e0 = (char *)0x0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined4 **)0x1a789e;
  local_2a8 = "";
  local_2b8 = &local_310;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db400;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_318;
  local_300 = local_300 & 0xffffffffffffff00;
  local_308 = &PTR__lazy_ostream_001db940;
  sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2e8._0_1_ = (long)ppEStack_1e8 - (long)local_1f0 == 0x20;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_320 = (undefined *)((long)ppEStack_168 - (long)local_170 >> 3);
  local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
  local_2a0 = &PTR__lazy_ostream_001db440;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2e8 = (char *)CONCAT71(local_2e8._1_7_,ppEStack_168 == local_170);
  local_324 = 0;
  local_2e0 = (char *)0x0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined4 **)0x1a789e;
  local_2a8 = "";
  local_310 = &local_320;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db400;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_310;
  local_318 = &local_324;
  local_300 = local_300 & 0xffffffffffffff00;
  local_308 = &PTR__lazy_ostream_001db940;
  sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_318;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_2a0,&local_2b0,0x21d,1,2,2,"col.size()",&local_2d0,"0",&local_308);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar5 = Gudhi::persistence_matrix::operator==
                    ((local_278->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                      *)local_210);
  local_308 = (undefined **)CONCAT71(local_308._1_7_,bVar5);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined **)0x1b1974;
  local_298 = "";
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db3b0;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_2b8 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  for (p_Var7 = (local_280->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if (p_Var7[2]._M_left != (_Base_ptr)0x0) {
      lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var7[1]._M_left);
      if ((*(uint *)(lVar6 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar6 + 0x24) & 0x1f) & 1) != 0)) {
        local_240 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_238 = "";
        local_250 = &boost::unit_test::basic_cstring<char_const>::null;
        local_248 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x225,
                   &local_250);
        local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
        local_2a0 = &PTR__lazy_ostream_001db440;
        sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_288 = "";
        local_320 = (undefined *)CONCAT44(local_320._4_4_,*(int *)(lVar6 + 0x20));
        local_324 = 6;
        local_2e8 = (char *)CONCAT71(local_2e8._1_7_,*(int *)(lVar6 + 0x20) == 6);
        local_2e0 = (char *)0x0;
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_2b0 = (undefined4 **)0x1a789e;
        local_2a8 = "";
        local_310 = &local_320;
        local_2c8 = 0;
        local_2d0 = &PTR__lazy_ostream_001db900;
        local_2c0 = &boost::unit_test::lazy_ostream::inst;
        local_2b8 = &local_310;
        local_318 = &local_324;
        local_300 = local_300 & 0xffffffffffffff00;
        local_308 = &PTR__lazy_ostream_001db940;
        sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2f0 = &local_318;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2e8,&local_2a0,&local_2b0,0x225,1,2,2,"entry.get_column_index()",
                   &local_2d0,"6",&local_308);
        boost::detail::shared_count::~shared_count(&sStack_2d8);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_190,
             (Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_210);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_320 = (undefined *)((long)ppEStack_1e8 - (long)local_1f0 >> 3);
  local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
  local_2a0 = &PTR__lazy_ostream_001db440;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_324 = 0;
  local_2e0 = (char *)0x0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined4 **)0x1a789e;
  local_2a8 = "";
  local_310 = &local_320;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db400;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_310;
  local_318 = &local_324;
  local_300 = local_300 & 0xffffffffffffff00;
  local_308 = &PTR__lazy_ostream_001db940;
  sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_318;
  local_2e8._0_1_ = ppEStack_1e8 == local_1f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
  local_2a0 = &PTR__lazy_ostream_001db440;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_320 = (undefined *)((long)ppEStack_168 - (long)local_170 >> 3);
  local_2e8 = (char *)CONCAT71(local_2e8._1_7_,(long)ppEStack_168 - (long)local_170 == 0x20);
  local_324 = 4;
  local_2e0 = (char *)0x0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined4 **)0x1a789e;
  local_2a8 = "";
  local_310 = &local_320;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db400;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_310;
  local_318 = &local_324;
  local_300 = local_300 & 0xffffffffffffff00;
  local_308 = &PTR__lazy_ostream_001db940;
  sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_318;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_2a0,&local_2b0,0x235,1,2,2,"col.size()",&local_2d0,"4",&local_308);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar5 = Gudhi::persistence_matrix::operator==
                    ((local_278->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                      *)local_190);
  local_308 = (undefined **)CONCAT71(local_308._1_7_,bVar5);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined **)0x1b1989;
  local_298 = "";
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001db3b0;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_2b8 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  for (p_Var7 = (local_280->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if (p_Var7[2]._M_left != (_Base_ptr)0x0) {
      lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var7[1]._M_left);
      if ((*(uint *)(lVar6 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar6 + 0x24) & 0x1f) & 1) != 0)) {
        local_260 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_258 = "";
        local_270 = &boost::unit_test::basic_cstring<char_const>::null;
        local_268 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x23d,
                   &local_270);
        local_298 = (char *)((ulong)local_298 & 0xffffffffffffff00);
        local_2a0 = &PTR__lazy_ostream_001db440;
        sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_288 = "";
        local_320 = (undefined *)CONCAT44(local_320._4_4_,*(int *)(lVar6 + 0x20));
        local_324 = 6;
        local_2e8 = (char *)CONCAT71(local_2e8._1_7_,*(int *)(lVar6 + 0x20) == 6);
        local_2e0 = (char *)0x0;
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_2b0 = (undefined4 **)0x1a789e;
        local_2a8 = "";
        local_310 = &local_320;
        local_2c8 = 0;
        local_2d0 = &PTR__lazy_ostream_001db900;
        local_2c0 = &boost::unit_test::lazy_ostream::inst;
        local_2b8 = &local_310;
        local_318 = &local_324;
        local_300 = local_300 & 0xffffffffffffff00;
        local_308 = &PTR__lazy_ostream_001db940;
        sStack_2f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2f0 = &local_318;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2e8,&local_2a0,&local_2b0,0x23d,1,2,2,"entry.get_column_index()",
                   &local_2d0,"6",&local_308);
        boost::detail::shared_count::~shared_count(&sStack_2d8);
      }
    }
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column((Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                    *)local_210);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column((Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                    *)local_190);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}